

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

bool Refal2::CInternalProgramBuilder::Check(CModuleDataVector *modules,CErrorsHelper *errors)

{
  bool bVar1;
  CInternalProgramBuilder builder;
  CInternalProgramBuilder CStack_78;
  
  bVar1 = CErrorsHelper::HasErrors(errors);
  if ((bVar1) ||
     ((modules->
      super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (modules->
      super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = false;
  }
  else {
    CInternalProgramBuilder(&CStack_78,errors);
    processModules(&CStack_78,modules,0x1290c0);
    bVar1 = CErrorsHelper::HasErrors(errors);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      check(&CStack_78);
      bVar1 = CErrorsHelper::HasErrors(errors);
      bVar1 = !bVar1;
    }
    if (CStack_78.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (CStack_78.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~CDictionary(&CStack_78.globals);
  }
  std::
  vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
  ::_M_erase_at_end(modules,(modules->
                            super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
  return bVar1;
}

Assistant:

bool CInternalProgramBuilder::Check( CModuleDataVector& modules,
	CErrorsHelper& errors )
{
	bool result = false;
	if( !errors.HasErrors() && !modules.empty() ) {
		CInternalProgramBuilder builder( errors );
		builder.collect( modules );
		if( !errors.HasErrors() ) {
			builder.check();
			result = !errors.HasErrors();
		}
	}
	modules.clear();
	return result;
}